

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Point_Object_State_PDU::Decode
          (Point_Object_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x57 < iVar2 + (uint)KVar1) {
    Object_State_Header::Decode(&this->super_Object_State_Header,stream,ignoreHeader);
    KDataStream::Read(stream,&(this->super_Object_State_Header).field_0x4b);
    (*(this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ObjTyp,stream);
    (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Loc,stream);
    (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
    (*(this->m_Apperance).super_ObjectAppearance.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_Apperance,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    (*(this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ReqID,stream);
    (*(this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_RecvID,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding1);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Point_Object_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < POINT_OBJECT_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Object_State_Header::Decode( stream, ignoreHeader );

    stream >> m_ModificationUnion.m_ui8Modifications
           >> KDIS_STREAM m_ObjTyp
           >> KDIS_STREAM m_Loc
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_Apperance
           >> m_ui16Padding
           >> KDIS_STREAM m_ReqID
           >> KDIS_STREAM m_RecvID
           >> m_ui32Padding1;
}